

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeDee.cpp
# Opt level: O0

int TeeDee::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  int iVar2;
  EffectData *pEVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_90;
  float local_88;
  float local_84;
  float local_80;
  int local_78;
  float inval;
  int i;
  float hpf;
  float bw;
  float cut;
  float outval;
  uint n;
  UInt64 pattern_length;
  float inputmix;
  float wetTarget;
  float pdecay;
  float fdecay;
  float adecay;
  float sr_half;
  float st;
  float sr;
  Data *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar3 = UnityAudioEffectState::GetEffectData<TeeDee::EffectData>(state);
  fVar6 = (float)(state->field_0).field_0.samplerate;
  fVar1 = (pEVar3->field_0).data.p[7];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_80 = powf(0.01,1.0 / (fVar6 * (pEVar3->field_0).data.p[7]));
  }
  else {
    local_80 = 1.0;
  }
  fVar1 = (pEVar3->field_0).data.p[8];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_84 = powf(0.01,1.0 / (fVar6 * (pEVar3->field_0).data.p[8]));
  }
  else {
    local_84 = 1.0;
  }
  fVar1 = (pEVar3->field_0).data.p[9];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_88 = powf(0.01,1.0 / (fVar6 * (pEVar3->field_0).data.p[9]));
  }
  else {
    local_88 = 1.0;
  }
  bVar5 = false;
  if (((state->field_0).field_0.flags & 1) != 0) {
    bVar5 = ((state->field_0).field_0.flags & 6) == 0;
  }
  local_90 = 1.0;
  if (!bVar5) {
    local_90 = 0.0;
  }
  fVar1 = (pEVar3->field_0).data.p[0x10];
  fVar7 = (fVar6 * 0.25 * 60.0) / (pEVar3->field_0).data.p[1];
  uVar4 = (ulong)fVar7;
  uVar4 = uVar4 | (long)(fVar7 - 9.223372e+18) & (long)uVar4 >> 0x3f;
  for (cut = 0.0; (uint)cut < length; cut = (float)((int)cut + 1)) {
    if ((((state->field_0).field_0.currdsptick + (ulong)(uint)cut) % uVar4 == 0) &&
       ((pEVar3->field_0).data.pattern_index =
             (int)((((state->field_0).field_0.currdsptick + (ulong)(uint)cut) / uVar4) %
                  (ulong)(long)(int)(pEVar3->field_0).data.p[0x11]),
       *(int *)((long)&pEVar3->field_0 + (long)(pEVar3->field_0).data.pattern_index * 4) != 0)) {
      (pEVar3->field_0).data.aenv = (pEVar3->field_0).data.p[0xc];
      (pEVar3->field_0).data.fenv = (pEVar3->field_0).data.p[0xd];
      (pEVar3->field_0).data.penv = (pEVar3->field_0).data.p[0xe];
    }
    (pEVar3->field_0).data.phase =
         ((pEVar3->field_0).data.p[6] + (pEVar3->field_0).data.penv) * (1.0 / fVar6) +
         (pEVar3->field_0).data.phase;
    iVar2 = FastFloor((pEVar3->field_0).data.phase);
    (pEVar3->field_0).data.phase = (pEVar3->field_0).data.phase - (float)iVar2;
    (pEVar3->field_0).data.aenv = (pEVar3->field_0).data.aenv * local_80 + 1e-11;
    (pEVar3->field_0).data.fenv = (pEVar3->field_0).data.fenv * local_84 + 1e-11;
    (pEVar3->field_0).data.penv = (pEVar3->field_0).data.penv * local_88 + 1e-11;
    fVar8 = sinf((pEVar3->field_0).data.phase * 2.0 * 3.1415927);
    fVar7 = (pEVar3->field_0).data.p[2];
    fVar9 = Random::GetFloat(&(pEVar3->field_0).data.random,-1.0,1.0);
    fVar8 = atanf((fVar8 * fVar7 + fVar9 * (pEVar3->field_0).data.p[3]) *
                  (pEVar3->field_0).data.p[0xf]);
    fVar7 = (pEVar3->field_0).data.aenv;
    hpf = (pEVar3->field_0).data.p[4] + (pEVar3->field_0).data.fenv;
    if (0.0 <= hpf) {
      if (fVar6 * 0.5 < hpf) {
        hpf = fVar6 * 0.5;
      }
    }
    else {
      hpf = 0.0;
    }
    fVar9 = sinf(hpf * 1.5707964 * (1.0 / fVar6));
    hpf = fVar9 * 2.0;
    if (1.4 < hpf) {
      hpf = 1.4;
    }
    fVar9 = 1.0 - (pEVar3->field_0).data.p[5];
    (pEVar3->field_0).data.lpf = hpf * (pEVar3->field_0).data.bpf + (pEVar3->field_0).data.lpf;
    fVar7 = -(pEVar3->field_0).data.bpf * fVar9 * fVar9 +
            (fVar8 * 0.31830987 * fVar7 - (pEVar3->field_0).data.lpf);
    (pEVar3->field_0).data.bpf = hpf * fVar7 + (pEVar3->field_0).data.bpf;
    (pEVar3->field_0).data.wetmix =
         (local_90 - (pEVar3->field_0).data.wetmix) * 0.05 + 1e-09 + (pEVar3->field_0).data.wetmix;
    fVar8 = atanf(((fVar7 - (pEVar3->field_0).data.lpf) * (pEVar3->field_0).data.p[10] +
                  (pEVar3->field_0).data.lpf) * (pEVar3->field_0).data.p[0xb]);
    fVar7 = (pEVar3->field_0).data.aenv;
    for (local_78 = 0; local_78 < outchannels; local_78 = local_78 + 1) {
      fVar9 = inbuffer[(uint)((int)cut * inchannels + local_78)];
      outbuffer[(uint)((int)cut * outchannels + local_78)] =
           ((fVar9 * fVar1 * 0.01 + fVar8 * 0.31830987 * fVar7) - fVar9) *
           (pEVar3->field_0).data.wetmix + fVar9;
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        float sr = (float)state->samplerate;
        float st = 1.0f / sr;
        float sr_half = sr * 0.5f;
        float adecay = (data->p[P_ADECAY] == 0) ? 1.0f : powf(0.01f, 1.0f / (sr * data->p[P_ADECAY]));
        float fdecay = (data->p[P_FDECAY] == 0) ? 1.0f : powf(0.01f, 1.0f / (sr * data->p[P_FDECAY]));
        float pdecay = (data->p[P_PDECAY] == 0) ? 1.0f : powf(0.01f, 1.0f / (sr * data->p[P_PDECAY]));
        float wetTarget = ((state->flags & UnityAudioEffectStateFlags_IsPlaying) && !(state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused))) ? 1.0f : 0.0f;
        float inputmix = data->p[P_INPUTMIX] * 0.01f;
        UInt64 pattern_length = (UInt64)(sr * 0.25f * 60.0f / data->p[P_BPM]);
        for (unsigned int n = 0; n < length; n++)
        {
            if (((state->currdsptick + n) % pattern_length) == 0)
            {
                data->pattern_index = ((state->currdsptick + n) / pattern_length) % (int)data->p[P_NUMSTEPS];
                if (data->pattern[data->pattern_index])
                {
                    data->aenv = data->p[P_AENV];
                    data->fenv = data->p[P_FENV];
                    data->penv = data->p[P_PENV];
                }
            }
            data->phase += (data->p[P_FREQ] + data->penv) * st;
            data->phase -= FastFloor(data->phase);
            data->aenv = data->aenv * adecay + 1.0e-11f;
            data->fenv = data->fenv * fdecay + 1.0e-11f;
            data->penv = data->penv * pdecay + 1.0e-11f;
            float outval = sinf(data->phase * 2.0f * kPI) * data->p[P_SINE] + data->random.GetFloat(-1.0f, 1.0f) * data->p[P_NOISE];
            outval = atanf(outval * data->p[P_PREDIST]) * (1.0f / kPI) * data->aenv;
            float cut = data->p[P_CUT] + data->fenv;
            if (cut < 0.0f)
                cut = 0.0f;
            else if (cut > sr_half)
                cut = sr_half;
            cut = 2.0f * sinf(0.5f * kPI * cut * st);
            if (cut > 1.4f)
                cut = 1.4f;
            float bw = 1.0f - data->p[P_RES]; bw *= bw;
            data->lpf += cut * data->bpf;
            float hpf = outval - data->lpf - data->bpf * bw;
            data->bpf += cut * hpf;
            data->wetmix += (wetTarget - data->wetmix) * 0.05f + 1.0e-9f;
            outval = data->lpf + (hpf - data->lpf) * data->p[P_FILTERTYPE];
            outval = atanf(outval * data->p[P_POSTDIST]) * (1.0f / kPI) * data->aenv;
            for (int i = 0; i < outchannels; i++)
            {
                float inval = inbuffer[n * inchannels + i];
                outbuffer[n * outchannels + i] = inval + (outval + inval * inputmix - inval) * data->wetmix;
            }
        }

        return UNITY_AUDIODSP_OK;
    }